

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

nng_err nng_pipe_notify(nng_socket s,nng_pipe_ev ev,nng_pipe_cb cb,void *arg)

{
  nng_err nVar1;
  nni_sock *local_30;
  nni_sock *sock;
  
  nVar1 = nni_sock_find(&local_30,s.id);
  if (nVar1 == NNG_OK) {
    nni_sock_set_pipe_cb(local_30,ev,cb,arg);
    nni_sock_rele(local_30);
  }
  return nVar1;
}

Assistant:

nng_err
nng_pipe_notify(nng_socket s, nng_pipe_ev ev, nng_pipe_cb cb, void *arg)
{
	nng_err   rv;
	nni_sock *sock;

	if ((rv = nni_sock_find(&sock, s.id)) != 0) {
		return (rv);
	}

	nni_sock_set_pipe_cb(sock, ev, cb, arg);
	nni_sock_rele(sock);
	return (NNG_OK);
}